

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

ArchType parseBPFArch(StringRef ArchName)

{
  size_t sVar1;
  size_t sVar2;
  char *__s1;
  bool bVar3;
  bool bVar4;
  bool local_1e9;
  StringRef ArchName_local;
  int local_8c;
  int local_6c;
  int local_4c;
  int local_2c;
  int local_c;
  
  sVar2 = ArchName.Length;
  __s1 = ArchName.Data;
  sVar1 = strlen("bpf");
  local_1e9 = false;
  if (sVar2 == sVar1) {
    if (sVar1 == 0) {
      local_8c = 0;
    }
    else {
      local_8c = memcmp(__s1,"bpf",sVar1);
    }
    local_1e9 = local_8c == 0;
  }
  if (local_1e9) {
    ArchName_local.Length._4_4_ = bpfel;
  }
  else {
    sVar1 = strlen("bpf_be");
    bVar3 = false;
    if (sVar2 == sVar1) {
      if (sVar1 == 0) {
        local_6c = 0;
      }
      else {
        local_6c = memcmp(__s1,"bpf_be",sVar1);
      }
      bVar3 = local_6c == 0;
    }
    bVar4 = true;
    if (!bVar3) {
      sVar1 = strlen("bpfeb");
      bVar4 = false;
      if (sVar2 == sVar1) {
        if (sVar1 == 0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(__s1,"bpfeb",sVar1);
        }
        bVar4 = local_4c == 0;
      }
    }
    if (bVar4) {
      ArchName_local.Length._4_4_ = bpfeb;
    }
    else {
      sVar1 = strlen("bpf_le");
      bVar3 = false;
      if (sVar2 == sVar1) {
        if (sVar1 == 0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp(__s1,"bpf_le",sVar1);
        }
        bVar3 = local_2c == 0;
      }
      bVar4 = true;
      if (!bVar3) {
        sVar1 = strlen("bpfel");
        bVar4 = false;
        if (sVar2 == sVar1) {
          if (sVar1 == 0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(__s1,"bpfel",sVar1);
          }
          bVar4 = local_c == 0;
        }
      }
      if (bVar4) {
        ArchName_local.Length._4_4_ = bpfel;
      }
      else {
        ArchName_local.Length._4_4_ = UnknownArch;
      }
    }
  }
  return ArchName_local.Length._4_4_;
}

Assistant:

static Triple::ArchType parseBPFArch(StringRef ArchName) {
  if (ArchName.equals("bpf")) {
    if (sys::IsLittleEndianHost)
      return Triple::bpfel;
    else
      return Triple::bpfeb;
  } else if (ArchName.equals("bpf_be") || ArchName.equals("bpfeb")) {
    return Triple::bpfeb;
  } else if (ArchName.equals("bpf_le") || ArchName.equals("bpfel")) {
    return Triple::bpfel;
  } else {
    return Triple::UnknownArch;
  }
}